

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void __thiscall
brotli::Hashers::WarmupHash<brotli::HashLongestMatch<14,5,4>>
          (Hashers *this,size_t size,uint8_t *dict,HashLongestMatch<14,_5,_4> *hasher)

{
  long local_30;
  size_t i;
  HashLongestMatch<14,_5,_4> *hasher_local;
  uint8_t *dict_local;
  size_t size_local;
  Hashers *this_local;
  
  HashLongestMatch<14,_5,_4>::Init(hasher);
  for (local_30 = 0; local_30 + 3U < size; local_30 = local_30 + 1) {
    HashLongestMatch<14,_5,_4>::Store(hasher,dict + local_30,(uint32_t)local_30);
  }
  return;
}

Assistant:

void WarmupHash(const size_t size, const uint8_t* dict, Hasher* hasher) {
    hasher->Init();
    for (size_t i = 0; i + Hasher::kHashTypeLength - 1 < size; i++) {
      hasher->Store(&dict[i], static_cast<uint32_t>(i));
    }
  }